

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O3

bool CompareBones(aiMesh *orig,aiMesh *inst)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  aiBone *paVar5;
  aiBone *paVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar3 = orig->mNumBones;
  if (uVar3 == 0) {
    bVar9 = true;
  }
  else {
    bVar9 = false;
    uVar7 = 0;
    do {
      paVar5 = orig->mBones[uVar7];
      paVar6 = inst->mBones[uVar7];
      uVar4 = paVar5->mNumWeights;
      if (uVar4 != paVar6->mNumWeights) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).a1;
      if (fVar2 != (paVar6->mOffsetMatrix).a1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN((paVar6->mOffsetMatrix).a1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).a2;
      pfVar1 = &(paVar6->mOffsetMatrix).a2;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).a3;
      pfVar1 = &(paVar6->mOffsetMatrix).a3;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).a4;
      pfVar1 = &(paVar6->mOffsetMatrix).a4;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).b1;
      pfVar1 = &(paVar6->mOffsetMatrix).b1;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).b2;
      pfVar1 = &(paVar6->mOffsetMatrix).b2;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).b3;
      pfVar1 = &(paVar6->mOffsetMatrix).b3;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).b4;
      pfVar1 = &(paVar6->mOffsetMatrix).b4;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).c1;
      pfVar1 = &(paVar6->mOffsetMatrix).c1;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).c2;
      pfVar1 = &(paVar6->mOffsetMatrix).c2;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).c3;
      pfVar1 = &(paVar6->mOffsetMatrix).c3;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).c4;
      pfVar1 = &(paVar6->mOffsetMatrix).c4;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).d1;
      pfVar1 = &(paVar6->mOffsetMatrix).d1;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).d2;
      pfVar1 = &(paVar6->mOffsetMatrix).d2;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).d3;
      pfVar1 = &(paVar6->mOffsetMatrix).d3;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      fVar2 = (paVar5->mOffsetMatrix).d4;
      pfVar1 = &(paVar6->mOffsetMatrix).d4;
      if (fVar2 != *pfVar1) {
        return bVar9;
      }
      if (NAN(fVar2) || NAN(*pfVar1)) {
        return bVar9;
      }
      if ((ulong)uVar4 != 0) {
        uVar8 = 0;
        do {
          if (paVar5->mWeights[uVar8].mVertexId != paVar6->mWeights[uVar8].mVertexId) {
            return bVar9;
          }
          if (paVar5->mWeights[uVar8].mWeight - paVar6->mWeights[uVar8].mWeight < 0.01) {
            return bVar9;
          }
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      uVar7 = uVar7 + 1;
      bVar9 = uVar3 <= uVar7;
    } while (uVar7 != uVar3);
  }
  return bVar9;
}

Assistant:

bool CompareBones(const aiMesh* orig, const aiMesh* inst)
{
    for (unsigned int i = 0; i < orig->mNumBones;++i) {
        aiBone* aha = orig->mBones[i];
        aiBone* oha = inst->mBones[i];

        if (aha->mNumWeights   != oha->mNumWeights   ||
            aha->mOffsetMatrix != oha->mOffsetMatrix) {
            return false;
        }

        // compare weight per weight ---
        for (unsigned int n = 0; n < aha->mNumWeights;++n) {
            if  (aha->mWeights[n].mVertexId != oha->mWeights[n].mVertexId ||
                (aha->mWeights[n].mWeight - oha->mWeights[n].mWeight) < 10e-3f) {
                return false;
            }
        }
    }
    return true;
}